

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmValue.h
# Opt level: O1

bool __thiscall cmValue::IsSet(cmValue *this)

{
  string *psVar1;
  undefined8 in_RDX;
  bool bVar2;
  bool bVar3;
  string_view value;
  
  psVar1 = this->Value;
  bVar2 = psVar1 == (string *)0x0;
  if (!bVar2) {
    value._M_str._1_7_ = (undefined7)((ulong)in_RDX >> 8);
    value._M_str._0_1_ = bVar2;
    bVar3 = psVar1->_M_string_length != 0;
    if (bVar3 && !bVar2) {
      value._M_len = (size_t)(psVar1->_M_dataplus)._M_p;
      bVar3 = IsNOTFOUND((cmValue *)psVar1->_M_string_length,value);
      bVar3 = !bVar3;
    }
    return bVar3;
  }
  return false;
}

Assistant:

bool IsEmpty() const noexcept
  {
    return this->Value == nullptr || this->Value->empty();
  }